

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t1ha0.c
# Opt level: O0

t1ha0_function_t t1ha0_resolve(void)

{
  uint64_t uVar1;
  uint64_t features;
  t1ha0_function_t local_8;
  
  uVar1 = x86_cpu_features();
  if ((uVar1 & 0x2000000) == 0) {
    local_8 = t1ha1_le;
  }
  else if ((uVar1 & 0x1a000000) == 0x1a000000) {
    local_8 = t1ha0_ia32aes_avx;
    if ((uVar1 >> 0x20 & 0x20) != 0) {
      local_8 = t1ha0_ia32aes_avx2;
    }
  }
  else {
    local_8 = t1ha0_ia32aes_noavx;
  }
  return local_8;
}

Assistant:

t1ha0_resolve(void) {

#if T1HA0_AESNI_AVAILABLE && defined(__ia32__)
  uint64_t features = x86_cpu_features();
  if (features & UINT32_C(0x02000000) /* check for AES-NI */) {
    if ((features & UINT32_C(0x1A000000)) ==
        UINT32_C(0x1A000000) /* check for any AVX */)
      /* check for 'Advanced Vector Extensions 2' */
      return ((features >> 32) & 32) ? t1ha0_ia32aes_avx2 : t1ha0_ia32aes_avx;
    return t1ha0_ia32aes_noavx;
  }
#endif /* T1HA0_AESNI_AVAILABLE && __ia32__ */

#if __BYTE_ORDER__ == __ORDER_BIG_ENDIAN__
#if (UINTPTR_MAX > 0xffffFFFFul || ULONG_MAX > 0xffffFFFFul) &&                \
    (!defined(T1HA1_DISABLED) || !defined(T1HA2_DISABLED))
#ifndef T1HA1_DISABLED
  return t1ha1_be;
#else
  return t1ha2_atonce;
#endif /* T1HA1_DISABLED */
#else
  return t1ha0_32be;
#endif
#else /* __BYTE_ORDER__ != __ORDER_BIG_ENDIAN__ */
#if (UINTPTR_MAX > 0xffffFFFFul || ULONG_MAX > 0xffffFFFFul) &&                \
    (!defined(T1HA1_DISABLED) || !defined(T1HA2_DISABLED))
#ifndef T1HA1_DISABLED
  return t1ha1_le;
#else
  return t1ha2_atonce;
#endif /* T1HA1_DISABLED */
#else
  return t1ha0_32le;
#endif
#endif /* __BYTE_ORDER__ */
}